

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O0

int ixmlElement_setAttributeNodeNS(IXML_Element *element,IXML_Attr *newAttr,IXML_Attr **rtAttr)

{
  Nodeptr_conflict p_Var1;
  int iVar2;
  IXML_Node_conflict *nextSib;
  IXML_Node_conflict *preSib;
  IXML_Node_conflict *nextAttr;
  IXML_Node_conflict *prevAttr;
  IXML_Node_conflict *node;
  IXML_Node_conflict *attrNode;
  IXML_Attr **rtAttr_local;
  IXML_Attr *newAttr_local;
  IXML_Element *element_local;
  
  if ((element == (IXML_Element *)0x0) || (newAttr == (IXML_Attr *)0x0)) {
    element_local._4_4_ = 0x69;
  }
  else if ((newAttr->n).ownerDocument == (element->n).ownerDocument) {
    if ((newAttr->ownerElement == (IXML_Element *)0x0) || (newAttr->ownerElement == element)) {
      newAttr->ownerElement = element;
      node = (element->n).firstAttr;
      while ((node != (IXML_Node_conflict *)0x0 &&
             ((iVar2 = strcmp(node->localName,(newAttr->n).localName), iVar2 != 0 ||
              (iVar2 = strcmp(node->namespaceURI,(newAttr->n).namespaceURI), iVar2 != 0))))) {
        node = node->nextSibling;
      }
      if (node == (IXML_Node_conflict *)0x0) {
        if ((element->n).firstAttr == (Nodeptr_conflict)0x0) {
          (element->n).firstAttr = &newAttr->n;
          (newAttr->n).prevSibling = (Nodeptr_conflict)0x0;
          (newAttr->n).nextSibling = (Nodeptr_conflict)0x0;
        }
        else {
          nextAttr = (element->n).firstAttr;
          for (preSib = nextAttr->nextSibling; preSib != (IXML_Node_conflict *)0x0;
              preSib = preSib->nextSibling) {
            nextAttr = preSib;
          }
          nextAttr->nextSibling = &newAttr->n;
        }
        if (rtAttr != (IXML_Attr **)0x0) {
          *rtAttr = (IXML_Attr *)0x0;
        }
      }
      else {
        p_Var1 = node->nextSibling;
        if (node->prevSibling != (Nodeptr_conflict)0x0) {
          node->prevSibling->nextSibling = &newAttr->n;
        }
        if (p_Var1 != (Nodeptr_conflict)0x0) {
          p_Var1->prevSibling = &newAttr->n;
        }
        if ((element->n).firstAttr == node) {
          (element->n).firstAttr = &newAttr->n;
        }
        *rtAttr = (IXML_Attr *)node;
      }
      element_local._4_4_ = 0;
    }
    else {
      element_local._4_4_ = 10;
    }
  }
  else {
    element_local._4_4_ = 4;
  }
  return element_local._4_4_;
}

Assistant:

int ixmlElement_setAttributeNodeNS(
	/* IN */ IXML_Element *element,
	/* IN */ IXML_Attr *newAttr,
	/* OUT */ IXML_Attr **rtAttr)
{
	IXML_Node *attrNode = NULL;
	IXML_Node *node = NULL;
	IXML_Node *prevAttr = NULL;
	IXML_Node *nextAttr = NULL;
	IXML_Node *preSib = NULL;
	IXML_Node *nextSib = NULL;

	if (element == NULL || newAttr == NULL) {
		return IXML_INVALID_PARAMETER;
	}

	if (newAttr->n.ownerDocument != element->n.ownerDocument) {
		return IXML_WRONG_DOCUMENT_ERR;
	}

	if (newAttr->ownerElement != NULL && newAttr->ownerElement != element) {
		return IXML_INUSE_ATTRIBUTE_ERR;
	}

	newAttr->ownerElement = element;
	node = (IXML_Node *)newAttr;
	attrNode = element->n.firstAttr;
	while (attrNode != NULL) {
		if (strcmp(attrNode->localName, node->localName) == 0 &&
			strcmp(attrNode->namespaceURI, node->namespaceURI) ==
				0) {
			/* Found it */
			break;
		} else {
			attrNode = attrNode->nextSibling;
		}
	}
	if (attrNode != NULL) {
		/* already present, will replace by newAttr */
		preSib = attrNode->prevSibling;
		nextSib = attrNode->nextSibling;
		if (preSib != NULL) {
			preSib->nextSibling = node;
		}
		if (nextSib != NULL) {
			nextSib->prevSibling = node;
		}
		if (element->n.firstAttr == attrNode) {
			element->n.firstAttr = node;
		}
		*rtAttr = (IXML_Attr *)attrNode;

	} else {
		/* Add this attribute  */
		if (element->n.firstAttr != NULL) {
			/* Element has attribute already */
			prevAttr = element->n.firstAttr;
			nextAttr = prevAttr->nextSibling;
			while (nextAttr != NULL) {
				prevAttr = nextAttr;
				nextAttr = prevAttr->nextSibling;
			}
			prevAttr->nextSibling = node;
		} else {
			/* This is the first attribute node */
			element->n.firstAttr = node;
			node->prevSibling = NULL;
			node->nextSibling = NULL;
		}
		if (rtAttr != NULL) {
			*rtAttr = NULL;
		}
	}

	return IXML_SUCCESS;
}